

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O3

void __thiscall Bind::Bind(Bind *this,double rate_constant,double volume,string *promoter_name)

{
  pointer pcVar1;
  runtime_error *this_00;
  
  (this->super_Reaction).super_enable_shared_from_this<Reaction>._M_weak_this.
  super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Reaction).super_enable_shared_from_this<Reaction>._M_weak_this.
  super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Reaction).old_prop_ = 0.0;
  (this->super_Reaction).remove_ = false;
  (this->super_Reaction).tRNA_reaction_ = false;
  (this->super_Reaction)._vptr_Reaction = (_func_int **)&PTR___cxa_pure_virtual_001a5ac8;
  this->rate_constant_ = rate_constant;
  (this->promoter_name_)._M_dataplus._M_p = (pointer)&(this->promoter_name_).field_2;
  pcVar1 = (promoter_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->promoter_name_,pcVar1,pcVar1 + promoter_name->_M_string_length);
  (this->super_Reaction).old_prop_ = 0.0;
  if (0.0 < volume) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Reaction volume cannot be zero.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Bind::Bind(double rate_constant, double volume,
           const std::string &promoter_name)
    : rate_constant_(rate_constant), promoter_name_(promoter_name) {
  old_prop_ = 0;
  // Check volume
  if (volume <= 0) {
    throw std::runtime_error("Reaction volume cannot be zero.");
  }
}